

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::createCompositeConstruct
          (TGlslangToSpvTraverser *this,Id resultTypeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents)

{
  Op OVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  Builder *pBVar4;
  Id IVar5;
  Id IVar6;
  Id typeId;
  uint uVar7;
  long lVar8;
  uint index;
  pointer puVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rTypeConstituents;
  Id local_a4;
  Builder *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Id local_7c;
  Id local_78;
  uint local_74;
  TGlslangToSpvTraverser *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  puVar9 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(constituents->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) >> 2)) {
    local_a0 = &this->builder;
    lVar8 = 0;
    local_7c = resultTypeId;
    local_70 = this;
    local_68 = constituents;
    do {
      IVar5 = spv::Builder::getContainedTypeId(local_a0,resultTypeId,(int)lVar8);
      pBVar4 = local_a0;
      ppIVar2 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar3 = ppIVar2[puVar9[lVar8]];
      IVar6 = 0;
      if (pIVar3 != (Instruction *)0x0) {
        IVar6 = pIVar3->typeId;
      }
      if (IVar5 != IVar6) {
        if ((this->glslangIntermediate->spvVersion).spv < 0x10400) {
          OVar1 = ppIVar2[IVar6]->opCode;
          local_78 = IVar5;
          if (OVar1 == OpTypeArray) {
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (uint *)0x0;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
            uVar7 = spv::Builder::getNumTypeConstituents(local_a0,IVar6);
            IVar6 = spv::Builder::getContainedTypeId(pBVar4,IVar6);
            if (0 < (int)uVar7) {
              index = 0;
              do {
                local_a4 = spv::Builder::createCompositeExtract(local_a0,puVar9[lVar8],IVar6,index);
                if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_98,
                             (iterator)
                             local_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_a4);
                }
                else {
                  *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_a4;
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                index = index + 1;
              } while (uVar7 != index);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,&local_98);
            this = local_70;
            IVar6 = createCompositeConstruct(local_70,local_78,&local_60);
            resultTypeId = local_7c;
            (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar8] = IVar6;
            if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            if (OVar1 != OpTypeStruct) {
              __assert_fail("builder.isArrayType(rType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0xb5d,
                            "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createCompositeConstruct(spv::Id, std::vector<spv::Id>)"
                           );
            }
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (uint *)0x0;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
            local_74 = spv::Builder::getNumTypeConstituents(local_a0,IVar6);
            if (0 < (int)local_74) {
              uVar7 = 0;
              do {
                pBVar4 = local_a0;
                IVar5 = puVar9[lVar8];
                typeId = spv::Builder::getContainedTypeId(local_a0,IVar6,uVar7);
                local_a4 = spv::Builder::createCompositeExtract(pBVar4,IVar5,typeId,uVar7);
                if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_98,
                             (iterator)
                             local_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_a4);
                }
                else {
                  *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_a4;
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar7 = uVar7 + 1;
              } while (local_74 != uVar7);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,&local_98);
            this = local_70;
            IVar6 = createCompositeConstruct(local_70,local_78,&local_48);
            constituents = local_68;
            (local_68->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar8] = IVar6;
            resultTypeId = local_7c;
            if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              resultTypeId = local_7c;
            }
          }
          if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          IVar6 = spv::Builder::createUnaryOp(local_a0,OpCopyLogical,IVar5,puVar9[lVar8]);
          puVar9[lVar8] = IVar6;
        }
      }
      lVar8 = lVar8 + 1;
      puVar9 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(constituents->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9)
                          >> 2));
  }
  IVar6 = spv::Builder::createCompositeConstruct(&this->builder,resultTypeId,constituents);
  return IVar6;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createCompositeConstruct(spv::Id resultTypeId, std::vector<spv::Id> constituents)
{
    for (int c = 0; c < (int)constituents.size(); ++c) {
        spv::Id& constituent = constituents[c];
        spv::Id lType = builder.getContainedTypeId(resultTypeId, c);
        spv::Id rType = builder.getTypeId(constituent);
        if (lType != rType) {
            if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4) {
                constituent = builder.createUnaryOp(spv::OpCopyLogical, lType, constituent);
            } else if (builder.isStructType(rType)) {
                std::vector<spv::Id> rTypeConstituents;
                int numrTypeConstituents = builder.getNumTypeConstituents(rType);
                for (int i = 0; i < numrTypeConstituents; ++i) {
                    rTypeConstituents.push_back(builder.createCompositeExtract(constituent,
                        builder.getContainedTypeId(rType, i), i));
                }
                constituents[c] = createCompositeConstruct(lType, rTypeConstituents);
            } else {
                assert(builder.isArrayType(rType));
                std::vector<spv::Id> rTypeConstituents;
                int numrTypeConstituents = builder.getNumTypeConstituents(rType);

                spv::Id elementRType = builder.getContainedTypeId(rType);
                for (int i = 0; i < numrTypeConstituents; ++i) {
                    rTypeConstituents.push_back(builder.createCompositeExtract(constituent, elementRType, i));
                }
                constituents[c] = createCompositeConstruct(lType, rTypeConstituents);
            }
        }
    }
    return builder.createCompositeConstruct(resultTypeId, constituents);
}